

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

shared_ptr<const_mathiu::impl::Expr> __thiscall
mathiu::impl::mergeSum<mathiu::impl::Sum>(impl *this,Sum *c1,Sum *c2)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **pp_Var2;
  undefined8 *puVar3;
  _Base_ptr p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Base_ptr p_Var5;
  shared_ptr<const_mathiu::impl::Expr> sVar6;
  Sum result;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_58;
  
  local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  local_60->_M_use_count = 1;
  local_60->_M_weak_count = 1;
  local_60->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
  local_68 = local_60 + 1;
  *(undefined4 *)&local_60[1]._vptr__Sp_counted_base = 0;
  *(undefined1 *)&local_60[4]._M_use_count = 0;
  merge<mathiu::impl::Sum,mathiu::impl::mergeSum<mathiu::impl::Sum>(mathiu::impl::Sum_const&,mathiu::impl::Sum_const&)::_lambda(auto:1&&,auto:2&&)_1_,std::shared_ptr<mathiu::impl::Expr_const>>
            (&local_58,(impl *)c1,c2);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_58._M_impl.super__Rb_tree_header._M_node_count == 1) {
    *(_Base_ptr *)this = local_58._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_left;
    p_Var4 = local_58._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_right;
    *(_Base_ptr *)(this + 8) = p_Var4;
    if (p_Var4 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var4->_M_parent = *(int *)&p_Var4->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var4->_M_parent = *(int *)&p_Var4->_M_parent + 1;
      }
    }
  }
  else {
    puVar3 = (undefined8 *)operator_new(0x50);
    puVar3[1] = 0x100000001;
    *puVar3 = &PTR___Sp_counted_ptr_inplace_00263778;
    p_Var4 = (_Base_ptr)(puVar3 + 3);
    if (local_58._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      puVar3[4] = 0;
      local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      p_Var5 = p_Var4;
      pp_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)puVar3;
    }
    else {
      p_Var1 = &local_58._M_impl.super__Rb_tree_header;
      puVar3[4] = local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var4;
      puVar3[7] = local_58._M_impl.super__Rb_tree_header._M_node_count;
      local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var4 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 = local_58._M_impl.super__Rb_tree_header._M_header._M_right;
      pp_Var2 = &local_68;
      local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    puVar3[5] = p_Var4;
    puVar3[6] = p_Var5;
    pp_Var2[7] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Rb_tree_color *)(puVar3 + 3) = local_58._M_impl.super__Rb_tree_header._M_header._M_color;
    *(undefined1 *)(puVar3 + 9) = 7;
    *(undefined8 **)(this + 8) = puVar3;
    *(undefined8 **)this = puVar3 + 2;
  }
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~_Rb_tree(&local_58);
  sVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_mathiu::impl::Expr>)
         sVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto mergeSum(C const &c1, C const &c2)
    {
        constexpr auto add = [](auto &&lhs, auto &&rhs)
        { return lhs + rhs; };
        auto result = merge(c1, c2, add, 0_i);
        ;
        if (result.size() == 1)
        {
            return (*result.begin()).second;
        }
        return makeSharedExprPtr(std::move(result));
    }